

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O2

ReconciliationRegisterResult __thiscall
TxReconciliationTracker::Impl::RegisterPeer
          (Impl *this,NodeId peer_id,bool is_peer_inbound,uint32_t peer_recon_version,
          uint64_t remote_salt)

{
  long lVar1;
  ulong uVar2;
  string_view source_file;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  __node_ptr p_Var6;
  Logger *pLVar7;
  HashWriter *pHVar8;
  char *__c;
  long lVar9;
  ulong __bkt;
  __hash_code __code;
  byte bVar10;
  undefined8 *puVar11;
  ulong *puVar12;
  unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
  *this_00;
  string *psVar13;
  bool *args_1;
  ReconciliationRegisterResult RVar14;
  TxReconciliationState *__storage;
  variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *__v;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  bool is_peer_inbound_local;
  NodeId peer_id_local;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock12;
  ulong local_100 [4];
  ulong local_e0 [4];
  uint256 full_salt;
  string log_msg;
  
  bVar10 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __c = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
  ;
  args_1 = (bool *)0x64;
  RVar14 = NOT_FOUND;
  is_peer_inbound_local = is_peer_inbound;
  peer_id_local = peer_id;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock12,&this->m_txreconciliation_mutex,"m_txreconciliation_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
             ,100,false);
  this_00 = &this->m_states;
  __bkt = (ulong)peer_id % (this->m_states)._M_h._M_bucket_count;
  p_Var6 = std::
           _Hashtable<long,_std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,__bkt,&peer_id_local,(__hash_code)__c);
  if (p_Var6 != (__node_ptr)0x0) {
    if ((p_Var6->
        super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
        ).
        super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
        ._M_storage._M_storage.__data[0x20] == '\x01') {
      RVar14 = ALREADY_REGISTERED;
    }
    else {
      if (this->m_recon_version < peer_recon_version) {
        peer_recon_version = this->m_recon_version;
      }
      if (peer_recon_version == 0) {
        RVar14 = PROTOCOL_VIOLATION;
      }
      else {
        __v = (variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *)
              ((long)&(p_Var6->
                      super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                      ._M_storage._M_storage + 8);
        uVar2 = *(ulong *)&(__v->
                           super__Variant_base<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           ).
                           super__Move_assign_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           .
                           super__Copy_assign_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           .
                           super__Move_ctor_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           .
                           super__Copy_ctor_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           .
                           super__Variant_storage_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                           ._M_u;
        bVar5 = ::LogAcceptCategory((LogFlags)this_00,(Level)__bkt);
        if (bVar5) {
          pLVar7 = LogInstance();
          bVar5 = BCLog::Logger::Enabled(pLVar7);
          if (bVar5) {
            log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
            log_msg._M_string_length = 0;
            log_msg.field_2._M_local_buf[0] = '\0';
            tinyformat::format<long,bool>
                      ((string *)&full_salt,(tinyformat *)"Register peer=%d (inbound=%i)\n",
                       (char *)&peer_id_local,(long *)&is_peer_inbound_local,args_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &full_salt);
            std::__cxx11::string::~string((string *)&full_salt);
            pLVar7 = LogInstance();
            full_salt.super_base_blob<256U>.m_data._M_elems[0] = 'b';
            full_salt.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            full_salt.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            full_salt.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            full_salt.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            full_salt.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            full_salt.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            full_salt.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            full_salt.super_base_blob<256U>.m_data._M_elems._8_8_ = anon_var_dwarf_58207d;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
            ;
            source_file._M_len = 0x62;
            str._M_str = log_msg._M_dataplus._M_p;
            str._M_len = log_msg._M_string_length;
            logging_function._M_str = "RegisterPeer";
            logging_function._M_len = 0xc;
            BCLog::Logger::LogPrintStr
                      (pLVar7,str,logging_function,source_file,0x79,TXRECONCILIATION,Debug);
            std::__cxx11::string::~string((string *)&log_msg);
          }
        }
        puVar11 = &(anonymous_namespace)::RECON_SALT_HASHER;
        psVar13 = &log_msg;
        for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
          *(undefined8 *)((CSHA256 *)&psVar13->_M_dataplus)->s = *puVar11;
          puVar11 = puVar11 + (ulong)bVar10 * -2 + 1;
          psVar13 = (string *)((long)psVar13 + (ulong)bVar10 * -0x10 + 8);
        }
        puVar12 = local_e0;
        if (remote_salt < uVar2) {
          puVar12 = local_100;
        }
        local_100[0] = remote_salt;
        local_e0[0] = uVar2;
        pHVar8 = HashWriter::operator<<((HashWriter *)&log_msg,puVar12);
        puVar12 = local_e0;
        if (local_e0[0] < local_100[0]) {
          puVar12 = local_100;
        }
        pHVar8 = HashWriter::operator<<(pHVar8,puVar12);
        HashWriter::GetSHA256(&full_salt,pHVar8);
        uVar4 = full_salt.super_base_blob<256U>.m_data._M_elems._8_8_;
        uVar3 = full_salt.super_base_blob<256U>.m_data._M_elems._0_8_;
        bVar10 = is_peer_inbound_local ^ 1;
        if ((p_Var6->
            super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
            ).
            super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
            ._M_storage._M_storage.__data[0x20] == '\x01') {
          std::get<1ul,unsigned_long,(anonymous_namespace)::TxReconciliationState>(__v);
          (p_Var6->
          super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
          ).
          super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
          ._M_storage._M_storage.__data[8] = bVar10;
          *(undefined8 *)
           ((long)&(p_Var6->
                   super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                   ._M_storage._M_storage + 0x10) = uVar3;
          *(undefined8 *)
           ((long)&(p_Var6->
                   super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                   ._M_storage._M_storage + 0x18) = uVar4;
        }
        else {
          (p_Var6->
          super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
          ).
          super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
          ._M_storage._M_storage.__data[8] = bVar10;
          *(undefined8 *)
           ((long)&(p_Var6->
                   super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                   ._M_storage._M_storage + 0x10) =
               full_salt.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((long)&(p_Var6->
                   super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
                   ._M_storage._M_storage + 0x18) =
               full_salt.super_base_blob<256U>.m_data._M_elems._8_8_;
          (p_Var6->
          super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
          ).
          super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
          ._M_storage._M_storage.__data[0x20] = '\x01';
          std::get<1ul,unsigned_long,(anonymous_namespace)::TxReconciliationState>(__v);
        }
        RVar14 = SUCCESS;
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock12.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return RVar14;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        auto recon_state = m_states.find(peer_id);

        if (recon_state == m_states.end()) return ReconciliationRegisterResult::NOT_FOUND;

        if (std::holds_alternative<TxReconciliationState>(recon_state->second)) {
            return ReconciliationRegisterResult::ALREADY_REGISTERED;
        }

        uint64_t local_salt = *std::get_if<uint64_t>(&recon_state->second);

        // If the peer supports the version which is lower than ours, we downgrade to the version
        // it supports. For now, this only guarantees that nodes with future reconciliation
        // versions have the choice of reconciling with this current version. However, they also
        // have the choice to refuse supporting reconciliations if the common version is not
        // satisfactory (e.g. too low).
        const uint32_t recon_version{std::min(peer_recon_version, m_recon_version)};
        // v1 is the lowest version, so suggesting something below must be a protocol violation.
        if (recon_version < 1) return ReconciliationRegisterResult::PROTOCOL_VIOLATION;

        LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Register peer=%d (inbound=%i)\n",
                      peer_id, is_peer_inbound);

        const uint256 full_salt{ComputeSalt(local_salt, remote_salt)};
        recon_state->second = TxReconciliationState(!is_peer_inbound, full_salt.GetUint64(0), full_salt.GetUint64(1));
        return ReconciliationRegisterResult::SUCCESS;
    }